

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  SequenceNumber *__mutex;
  long lVar1;
  _func_int **pp_Var2;
  pointer pOVar3;
  CleanupFunction p_Var4;
  Comparator *pCVar5;
  void *pvVar6;
  Logger *info_log;
  bool bVar7;
  int iVar8;
  long lVar9;
  SnapshotImpl *pSVar10;
  uint64_t *puVar11;
  Iterator *pIVar12;
  long lVar13;
  long lVar14;
  undefined4 extraout_var;
  uint64_t uVar15;
  undefined4 extraout_var_00;
  _func_int *p_Var16;
  char *pcVar17;
  long *plVar18;
  Iterator *in_RDX;
  undefined8 extraout_RDX;
  Env *extraout_RDX_00;
  CleanupFunction p_Var19;
  VersionSet *this_00;
  TableBuilder *pTVar20;
  ulong uVar21;
  ulong uVar22;
  long in_FS_OFFSET;
  bool bVar23;
  long local_120;
  undefined1 local_100 [32];
  ParsedInternalKey ikey;
  LevelSummaryStorage tmp;
  string current_user_key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  pp_Var2 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var2[0x19] - (long)pp_Var2[0x18]) >> 3,(ulong)*(uint *)pp_Var2,
      (ulong)((long)pp_Var2[0x1c] - (long)pp_Var2[0x1b]) >> 3);
  iVar8 = VersionSet::NumLevelFiles((VersionSet *)compact[8].outfile,*(int *)in_RDX->_vptr_Iterator)
  ;
  if (iVar8 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,899,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (compact[7].outputs.
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)(compact + 7)) {
    this_00 = (VersionSet *)compact[8].outfile;
    puVar11 = &this_00->last_sequence_;
  }
  else {
    pSVar10 = SnapshotList::oldest((SnapshotList *)(compact + 7));
    puVar11 = &pSVar10->sequence_number_;
    this_00 = (VersionSet *)compact[8].outfile;
  }
  p_Var19 = (CleanupFunction)0xffffffffffffff;
  (in_RDX->cleanup_head_).function = (CleanupFunction)*puVar11;
  pIVar12 = VersionSet::MakeInputIterator(this_00,(Compaction *)in_RDX->_vptr_Iterator);
  __mutex = &compact[3].smallest_snapshot;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*pIVar12->_vptr_Iterator[3])(pIVar12);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  ikey.user_key.data_ = "";
  ikey.user_key.size_ = 0;
  current_user_key._M_dataplus._M_p = (pointer)&current_user_key.field_2;
  current_user_key._M_string_length = 0;
  current_user_key.field_2._M_local_buf[0] = '\0';
  bVar23 = false;
  local_120 = 0;
  while ((iVar8 = (*pIVar12->_vptr_Iterator[2])(pIVar12), (char)iVar8 != '\0' &&
         (((ulong)compact[3].builder & 1) == 0))) {
    if (((ulong)compact[5].compaction & 1) != 0) {
      lVar13 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      std::mutex::lock((mutex *)__mutex);
      if (compact[4].total_bytes != 0) {
        CompactMemTable((DBImpl *)compact);
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      lVar14 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      local_120 = (local_120 - lVar13) + lVar14;
    }
    tmp.buffer._0_4_ = (*pIVar12->_vptr_Iterator[8])(pIVar12);
    tmp.buffer._4_4_ = extraout_var;
    tmp.buffer._8_8_ = extraout_RDX;
    bVar7 = Compaction::ShouldStopBefore((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&tmp);
    if ((bVar7) && (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_100,compact,in_RDX);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_100._0_8_;
      local_100._0_8_ = pp_Var2;
      Status::~Status((Status *)local_100);
      if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_005303da;
    }
    if ((ulong)tmp.buffer._8_8_ < 8) {
LAB_005301a6:
      current_user_key._M_string_length = 0;
      *current_user_key._M_dataplus._M_p = '\0';
      bVar23 = false;
      p_Var19 = (CleanupFunction)0xffffffffffffff;
LAB_005301cd:
      pTVar20 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      if (pTVar20 == (TableBuilder *)0x0) {
        OpenCompactionOutputFile((DBImpl *)local_100,compact);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_100._0_8_;
        local_100._0_8_ = pp_Var2;
        Status::~Status((Status *)local_100);
        if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_005303da;
        pTVar20 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      }
      uVar15 = TableBuilder::NumEntries(pTVar20);
      if (uVar15 == 0) {
        InternalKey::DecodeFrom
                  ((InternalKey *)((long)(in_RDX->cleanup_head_).arg2 + -0x40),(Slice *)&tmp);
      }
      InternalKey::DecodeFrom
                ((InternalKey *)((long)(in_RDX->cleanup_head_).arg2 + -0x20),(Slice *)&tmp);
      pTVar20 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      iVar8 = (*pIVar12->_vptr_Iterator[9])(pIVar12);
      local_100._0_8_ = CONCAT44(extraout_var_00,iVar8);
      local_100._8_8_ = extraout_RDX_00;
      TableBuilder::Add(pTVar20,(Slice *)&tmp,(Slice *)local_100);
      p_Var16 = (_func_int *)
                TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_head_.function);
      if (in_RDX->_vptr_Iterator[1] <= p_Var16) {
        FinishCompactionOutputFile((DBImpl *)local_100,compact,in_RDX);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_100._0_8_;
        local_100._0_8_ = pp_Var2;
        Status::~Status((Status *)local_100);
        if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_005303da;
      }
    }
    else {
      uVar21 = *(ulong *)(tmp.buffer._0_8_ + -8 + tmp.buffer._8_8_);
      ikey.type = (ValueType)uVar21 & 0xff;
      ikey.sequence = uVar21 >> 8;
      ikey.user_key.size_ = tmp.buffer._8_8_ - 8;
      ikey.user_key.data_ = (char *)tmp.buffer._0_8_;
      if (kTypeValue < ikey.type) goto LAB_005301a6;
      if (bVar23) {
        pOVar3 = (compact->outputs).
                 super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_100._0_8_ = current_user_key._M_dataplus._M_p;
        local_100._8_8_ = current_user_key._M_string_length;
        iVar8 = (**(code **)(pOVar3->number + 0x10))(pOVar3,&ikey,local_100);
        if (iVar8 != 0) goto LAB_0053015e;
      }
      else {
LAB_0053015e:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&current_user_key,ikey.user_key.data_,ikey.user_key.size_);
        p_Var19 = (CleanupFunction)0xffffffffffffff;
      }
      p_Var4 = (in_RDX->cleanup_head_).function;
      if (p_Var4 < p_Var19) {
        if (p_Var4 < ikey.sequence || ikey.type != kTypeDeletion) {
          bVar23 = true;
          p_Var19 = (CleanupFunction)ikey.sequence;
        }
        else {
          bVar7 = Compaction::IsBaseLevelForKey((Compaction *)in_RDX->_vptr_Iterator,&ikey.user_key)
          ;
          bVar23 = true;
          p_Var19 = (CleanupFunction)ikey.sequence;
          if (bVar7) goto LAB_005302ce;
        }
        goto LAB_005301cd;
      }
      bVar23 = true;
      p_Var19 = (CleanupFunction)ikey.sequence;
    }
LAB_005302ce:
    (*pIVar12->_vptr_Iterator[6])(pIVar12);
  }
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    if (((ulong)compact[3].builder & 1) != 0) {
      tmp.buffer._0_8_ = anon_var_dwarf_1a74157;
      tmp.buffer[8] = '\x1d';
      tmp.buffer[9] = '\0';
      tmp.buffer[10] = '\0';
      tmp.buffer[0xb] = '\0';
      tmp.buffer[0xc] = '\0';
      tmp.buffer[0xd] = '\0';
      tmp.buffer[0xe] = '\0';
      tmp.buffer[0xf] = '\0';
      local_100._0_8_ = "";
      local_100._8_8_ = (Env *)0x0;
      Status::IOError((Status *)(local_100 + 0x18),(Slice *)&tmp,(Slice *)local_100);
      pCVar5 = (Comparator *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_100._24_8_;
      local_100._24_8_ = pCVar5;
      Status::~Status((Status *)(local_100 + 0x18));
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
        FinishCompactionOutputFile((DBImpl *)&tmp,compact,in_RDX);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)tmp.buffer._0_8_;
        tmp.buffer._0_8_ = pp_Var2;
        Status::~Status((Status *)&tmp);
        if ((this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_005303da;
      }
      (*pIVar12->_vptr_Iterator[10])(&tmp);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)tmp.buffer._0_8_;
      tmp.buffer._0_8_ = pp_Var2;
      Status::~Status((Status *)&tmp);
    }
  }
LAB_005303da:
  (*pIVar12->_vptr_Iterator[1])(pIVar12);
  lVar13 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  local_100._0_8_ = lVar13 - (local_120 + lVar9);
  local_100._8_8_ = (Env *)0x0;
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    p_Var16 = in_RDX->_vptr_Iterator[lVar9 * 3 + 0x18];
    uVar21 = (ulong)((long)in_RDX->_vptr_Iterator[lVar9 * 3 + 0x19] - (long)p_Var16) >> 3;
    uVar22 = uVar21 & 0xffffffff;
    if ((int)uVar21 < 1) {
      uVar22 = 0;
    }
    for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
      local_100._8_8_ =
           (long)&((Env *)local_100._8_8_)->_vptr_Env +
           *(long *)(*(long *)(p_Var16 + uVar21 * 8) + 0x10);
    }
  }
  pvVar6 = (in_RDX->cleanup_head_).arg1;
  lVar9 = ((long)(in_RDX->cleanup_head_).arg2 - (long)pvVar6) / 0x50;
  plVar18 = (long *)((long)pvVar6 + 8);
  local_100._16_8_ = (_func_int **)0x0;
  while (bVar23 = lVar9 != 0, lVar9 = lVar9 + -1, bVar23) {
    local_100._16_8_ = local_100._16_8_ + *plVar18;
    plVar18 = plVar18 + 10;
  }
  std::mutex::lock((mutex *)__mutex);
  CompactionStats::Add
            ((CompactionStats *)(&compact[9].outputs + *(int *)in_RDX->_vptr_Iterator),
             (CompactionStats *)local_100);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    InstallCompactionResults((DBImpl *)&tmp,compact);
    pp_Var2 = (this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)tmp.buffer._0_8_;
    tmp.buffer._0_8_ = pp_Var2;
    Status::~Status((Status *)&tmp);
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) goto LAB_005304f0;
  }
  RecordBackgroundError((DBImpl *)compact,(Status *)this);
LAB_005304f0:
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar17 = VersionSet::LevelSummary((VersionSet *)compact[8].outfile,&tmp);
  Log(info_log,"compacted to: %s",pcVar17);
  std::__cxx11::string::~string((string *)&current_user_key);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}